

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall wasm::AfterEffectModuleChecker::check(AfterEffectModuleChecker *this)

{
  pointer pAVar1;
  bool bVar2;
  _Head_base<0UL,_wasm::Function_*,_false> _Var3;
  uint uVar4;
  ulong uVar5;
  iterator __begin3;
  pointer this_00;
  
  if ((this->beganWithAnyStackIR == true) && (bVar2 = hasAnyStackIR(this), bVar2)) {
    if (((long)(this->checkers).
               super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->checkers).
              super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x28 !=
        (long)(this->module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) {
      error(this);
    }
    uVar4 = 0;
    while( true ) {
      uVar5 = (ulong)uVar4;
      this_00 = (this->checkers).
                super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar1 = (this->checkers).
               super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pAVar1 - (long)this_00) / 0x28) <= uVar5) break;
      _Var3._M_head_impl =
           *(Function **)
            &(this->module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
      if ((_Var3._M_head_impl != this_00[uVar5].func) ||
         ((_Var3._M_head_impl)->body != *(Expression **)((long)this_00[uVar5].func + 0x60))) {
        error(this);
        this_00 = (this->checkers).
                  super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        _Var3._M_head_impl =
             *(Function **)
              &(this->module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
      }
      if (*(char **)&((Importable *)((long)_Var3._M_head_impl + 8))->super_Named !=
          this_00[uVar5].name.super_IString.str._M_str) {
        error(this);
      }
      uVar4 = uVar4 + 1;
    }
    for (; this_00 != pAVar1; this_00 = this_00 + 1) {
      AfterEffectFunctionChecker::check(this_00);
    }
  }
  return;
}

Assistant:

void check() {
    if (beganWithAnyStackIR && hasAnyStackIR()) {
      // If anything changed to the functions, that's not good.
      if (checkers.size() != module->functions.size()) {
        error();
      }
      for (Index i = 0; i < checkers.size(); i++) {
        // Did a pointer change? (a deallocated function could cause that)
        if (module->functions[i].get() != checkers[i].func ||
            module->functions[i]->body != checkers[i].func->body) {
          error();
        }
        // Did a name change?
        if (module->functions[i]->name != checkers[i].name) {
          error();
        }
      }
      // Global function state appears to not have been changed: the same
      // functions are there. Look into their contents.
      for (auto& checker : checkers) {
        checker.check();
      }
    }
  }